

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLenum gl4cts::EnhancedLayouts::Utils::Type::GetTypeGLenum(TYPES type)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  TYPES type_local;
  
  switch(type) {
  case Float:
    local_10 = 0x1406;
    break;
  case Double:
    local_10 = 0x140a;
    break;
  case Int:
    local_10 = 0x1404;
    break;
  case Uint:
    local_10 = 0x1405;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x2d5);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

GLenum Type::GetTypeGLenum(TYPES type)
{
	GLenum result = 0;

	switch (type)
	{
	case Float:
		result = GL_FLOAT;
		break;
	case Double:
		result = GL_DOUBLE;
		break;
	case Int:
		result = GL_INT;
		break;
	case Uint:
		result = GL_UNSIGNED_INT;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}